

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  pointer pcVar1;
  TestPartResultArray *in_RCX;
  char *in_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *in_RSI;
  char *message;
  char local_30 [8];
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  HasOneFailure(local_30,in_RSI,in_RDX,in_RCX,(Type)this->results_,(string *)(ulong)this->type_);
  if (local_30[0] == '\0') {
    Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest.cc"
               ,0x2ab,message);
    AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
    AssertHelper::~AssertHelper(&local_18);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
    }
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (this->substr_)._M_dataplus._M_p;
  paVar2 = &(this->substr_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}